

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::decode5
          (Predecoder<(InstructionSet::M68k::Model)1> *this,uint16_t instruction)

{
  uint uVar1;
  uint uVar2;
  Preinstruction PVar3;
  uint uVar4;
  Preinstruction PVar5;
  
  uVar4 = (uint)instruction;
  switch(instruction >> 3 & 0x3f) {
  case 0:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    PVar3 = decode<(unsigned_char)150,true>(this,instruction);
    break;
  default:
    if ((uVar4 & 0xfe) != 0xf8) {
      uVar1 = (uVar4 & 0xf8) - 0xc0;
      uVar2 = uVar1 >> 3;
      if (4 < uVar2 - 2) {
        if (uVar2 == 1) {
          uVar4 = uVar4 & 7;
          uVar1 = (instruction >> 6 & 0x3c) + 1;
          PVar5.operation = DBcc;
          PVar5.operands_[0] = '\0';
          PVar5.operands_[1] = '\0';
          PVar5.flags_ = '\0';
          PVar3.operation = Undefined;
          PVar3.operands_[0] = '\0';
          PVar3.operands_[1] = '`';
          PVar3.flags_ = '\0';
          goto LAB_001d8706;
        }
        if (uVar1 != 0) {
          uVar4 = 0xd;
          PVar3.operation = Undefined;
          PVar3.operands_[0] = '\0';
          PVar3.operands_[1] = '\r';
          PVar3.flags_ = '\0';
          uVar1 = 0;
          PVar5.operation = Undefined;
          PVar5.operands_[0] = '\0';
          PVar5.operands_[1] = '\0';
          PVar5.flags_ = '\0';
          goto LAB_001d8706;
        }
      }
    }
    PVar3 = decode<(unsigned_char)55,true>(this,instruction);
    break;
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    PVar3 = decode<(unsigned_char)151,true>(this,instruction);
    break;
  case 9:
    PVar3 = decode<(unsigned_char)153,true>(this,instruction);
    break;
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    PVar3 = decode<(unsigned_char)152,true>(this,instruction);
    break;
  case 0x11:
    PVar3 = decode<(unsigned_char)154,true>(this,instruction);
    break;
  case 0x20:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    PVar3 = decode<(unsigned_char)155,true>(this,instruction);
    break;
  case 0x28:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    PVar3 = decode<(unsigned_char)156,true>(this,instruction);
    break;
  case 0x29:
    PVar3 = decode<(unsigned_char)158,true>(this,instruction);
    break;
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    PVar3 = decode<(unsigned_char)157,true>(this,instruction);
    break;
  case 0x31:
    PVar3 = decode<(unsigned_char)159,true>(this,instruction);
  }
  uVar4 = (uint)PVar3 >> 8;
  uVar1 = (uint)PVar3 >> 0x18;
  PVar5 = PVar3;
LAB_001d8706:
  return (Preinstruction)
         ((uint)PVar5 & 0xff | (uVar4 & 0xff) << 8 | (uint)PVar3 & 0xff0000 | uVar1 << 0x18);
}

Assistant:

Preinstruction Predecoder<model>::decode5(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0x1f8) {
		// 4-11 (p115)
		case 0x000:
		case 0x010:	case 0x018:
		case 0x020:	case 0x028:
		case 0x030:	case 0x038:
			Decode(ADDQb);

		case 0x040:
		case 0x050:	case 0x058:
		case 0x060:	case 0x068:
		case 0x070:	case 0x078:
			Decode(ADDQw);

		case 0x080:
		case 0x090:	case 0x098:
		case 0x0a0:	case 0x0a8:
		case 0x0b0:	case 0x0b8:
			Decode(ADDQl);

		case 0x048:	Decode(ADDQAw);
		case 0x088:	Decode(ADDQAl);

		// 4-181 (p285)
		case 0x100:
		case 0x110:	case 0x118:
		case 0x120:	case 0x128:
		case 0x130:	case 0x138:
			Decode(SUBQb);

		case 0x140:
		case 0x150:	case 0x158:
		case 0x160:	case 0x168:
		case 0x170:	case 0x178:
			Decode(SUBQw);

		case 0x180:
		case 0x190:	case 0x198:
		case 0x1a0:	case 0x1a8:
		case 0x1b0:	case 0x1b8:
			Decode(SUBQl);

		case 0x148:	Decode(SUBQAw);
		case 0x188:	Decode(SUBQAl);

		default:	break;
	}

	switch(instruction & 0x0ff) {
		// 4-173 (p276)
		case 0x0f8:	case 0x0f9:	Decode(Op::Scc);

		// 4-189 (p294)
		case 0x0fa:	case 0x0fb:	case 0x0fc:
			DecodeReq(model >= Model::M68020, Op::TRAPcc);

		default:	break;
	}

	switch(instruction & 0x0f8) {
		// 4-173 (p276)
		case 0x0c0:
		case 0x0d0: case 0x0d8:
		case 0x0e0:	case 0x0e8:
		case 0x0f0:	Decode(Op::Scc);

		// 4-91 (p195)
		case 0x0c8:	Decode(Op::DBcc);

		default:	break;
	}
	return Preinstruction();
}